

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

void Sbl_ManClean(Sbl_Man_t *p)

{
  byte bVar1;
  sat_solver *psVar2;
  int **ppiVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  timespec ts;
  timespec local_18;
  long lVar12;
  
  iVar7 = clock_gettime(3,&local_18);
  if (iVar7 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_18.tv_nsec / 1000 + local_18.tv_sec * 1000000;
  }
  p->timeStart = lVar8;
  sat_solver_rollback(p->pSat);
  psVar2 = p->pSat;
  if (psVar2->qhead != psVar2->qtail) {
    __assert_fail("s->qhead == s->qtail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x137,"void sat_solver_bookmark(sat_solver *)");
  }
  iVar7 = psVar2->size;
  psVar2->iVarPivot = iVar7;
  psVar2->iTrailPivot = psVar2->qhead;
  *(undefined8 *)(psVar2->Mem).BookMarkE = *(undefined8 *)(psVar2->Mem).nEntries;
  iVar10 = (psVar2->Mem).iPage[0];
  bVar1 = (byte)(psVar2->Mem).nPageSize;
  ppiVar3 = (psVar2->Mem).pPages;
  (psVar2->Mem).BookMarkH[0] = iVar10 << (bVar1 & 0x1f) | *ppiVar3[iVar10];
  iVar10 = (psVar2->Mem).iPage[1];
  (psVar2->Mem).BookMarkH[1] = iVar10 << (bVar1 & 0x1f) | *ppiVar3[iVar10];
  if (psVar2->activity2 != (word *)0x0) {
    psVar2->var_inc2 = psVar2->var_inc;
    memcpy(psVar2->activity2,psVar2->activity,(long)iVar7 << 3);
  }
  p->vLeaves->nSize = 0;
  p->vAnds->nSize = 0;
  p->vNodes->nSize = 0;
  p->vRoots->nSize = 0;
  p->vRootVars->nSize = 0;
  p->vArrs->nSize = 0;
  p->vReqs->nSize = 0;
  auVar6 = _DAT_0093d220;
  pVVar4 = p->vWindow;
  iVar7 = pVVar4->nSize;
  if (0 < (long)iVar7) {
    pVVar5 = pVVar4->pArray;
    lVar8 = (long)iVar7 + -1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar9 = auVar9 ^ _DAT_0093d220;
    auVar11 = _DAT_0093e4e0;
    auVar13 = _DAT_0093d210;
    do {
      auVar14 = auVar13 ^ auVar6;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ || iVar10 < auVar14._4_4_
                  ) & 1)) {
        *(undefined4 *)((long)&pVVar5->nSize + lVar8) = 0;
      }
      if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
          auVar14._12_4_ <= auVar9._12_4_) {
        *(undefined4 *)((long)&pVVar5[1].nSize + lVar8) = 0;
      }
      auVar14 = auVar11 ^ auVar6;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
        *(undefined4 *)((long)&pVVar5[2].nSize + lVar8) = 0;
        *(undefined4 *)((long)&pVVar5[3].nSize + lVar8) = 0;
      }
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar12 + 4;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar12 + 4;
      lVar8 = lVar8 + 0x40;
    } while ((ulong)(iVar7 + 3U >> 2) << 6 != lVar8);
  }
  pVVar4->nSize = 0;
  p->vPath->nSize = 0;
  p->vEdges->nSize = 0;
  p->vCutsI1->nSize = 0;
  p->vCutsI2->nSize = 0;
  p->vCutsN1->nSize = 0;
  p->vCutsN2->nSize = 0;
  p->vCutsNum->nSize = 0;
  p->vCutsStart->nSize = 0;
  p->vCutsObj->nSize = 0;
  p->vSolInit->nSize = 0;
  p->vSolCur->nSize = 0;
  p->vSolBest->nSize = 0;
  p->vTempI1->nSize = 0;
  p->vTempI2->nSize = 0;
  p->vTempN1->nSize = 0;
  p->vTempN2->nSize = 0;
  p->vLits->nSize = 0;
  p->vAssump->nSize = 0;
  p->vPolar->nSize = 0;
  Gia_ManFillValue(p->pGia);
  return;
}

Assistant:

void Sbl_ManClean( Sbl_Man_t * p )
{
    p->timeStart = Abc_Clock();
    sat_solver_rollback( p->pSat );
    sat_solver_bookmark( p->pSat );
    // internal
    Vec_IntClear( p->vLeaves );
    Vec_IntClear( p->vAnds );
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vRoots );
    Vec_IntClear( p->vRootVars );
    // timing
    Vec_IntClear( p->vArrs );
    Vec_IntClear( p->vReqs );
    Vec_WecClear( p->vWindow );
    Vec_IntClear( p->vPath );
    Vec_IntClear( p->vEdges );
    // cuts
    Vec_WrdClear( p->vCutsI1 );
    Vec_WrdClear( p->vCutsI2 );
    Vec_WrdClear( p->vCutsN1 );
    Vec_WrdClear( p->vCutsN2 );
    Vec_IntClear( p->vCutsNum );
    Vec_IntClear( p->vCutsStart );
    Vec_IntClear( p->vCutsObj );
    Vec_IntClear( p->vSolInit );
    Vec_IntClear( p->vSolCur );
    Vec_IntClear( p->vSolBest );
    Vec_WrdClear( p->vTempI1 );
    Vec_WrdClear( p->vTempI2 );
    Vec_WrdClear( p->vTempN1 );
    Vec_WrdClear( p->vTempN2 );
    // temporary
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vAssump );
    Vec_IntClear( p->vPolar );
    // other
    Gia_ManFillValue( p->pGia );
}